

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsf.c
# Opt level: O2

Qiniu_Error
Qiniu_RSF_ListFiles(Qiniu_Client *self,Qiniu_RSF_ListRet *ret,char *bucket,char *prefix,
                   char *delimiter,char *marker,int limit)

{
  Qiniu_RSF_ListRet *pQVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char **ppcVar6;
  Qiniu_Json *pQVar7;
  Qiniu_Json *pQVar8;
  _Qiniu_RSF_ListItem *p_Var9;
  Qiniu_Int64 QVar10;
  Qiniu_Int64 QVar11;
  Qiniu_Int64 QVar12;
  long lVar13;
  ulong uVar14;
  Qiniu_Error QVar15;
  char *local_98;
  cJSON *root;
  Qiniu_Json *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  Qiniu_Bool escapeMarkerOk;
  Qiniu_Bool escapeDelimiterOk;
  Qiniu_Bool escapePrefixOk;
  Qiniu_Bool escapeBucketOk;
  char *local_50;
  Qiniu_RSF_ListRet *local_48;
  char *local_40;
  char *rsfHost;
  
  if (limit - 0x3e9U < 0xfffffc18) {
    local_50 = "invalid list limit";
    uVar3 = 400;
  }
  else {
    local_40 = Qiniu_QueryEscape(bucket,&escapeBucketOk);
    local_88 = (Qiniu_Json *)0x14e301;
    local_98 = "";
    if (prefix != (char *)0x0) {
      local_88 = (Qiniu_Json *)Qiniu_QueryEscape(prefix,&escapePrefixOk);
    }
    local_80 = "";
    local_78 = prefix;
    if (marker != (char *)0x0) {
      local_80 = Qiniu_QueryEscape(marker,&escapeMarkerOk);
    }
    local_68 = marker;
    local_48 = ret;
    if (delimiter != (char *)0x0) {
      local_98 = Qiniu_QueryEscape(delimiter,&escapeDelimiterOk);
    }
    local_70 = delimiter;
    iVar2 = snprintf((char *)0x0,0,"%d",(ulong)(uint)limit);
    pcVar4 = (char *)calloc(1,(long)(iVar2 + 1));
    snprintf(pcVar4,(long)(iVar2 + 1),"%d",(ulong)(uint)limit);
    QVar15 = _Qiniu_Region_Get_Rsf_Host(self,(char *)0x0,bucket,&rsfHost);
    pcVar5 = local_40;
    local_50 = QVar15.message;
    uVar3 = QVar15.code;
    if (uVar3 == 200) {
      bucket = Qiniu_String_Concat(rsfHost,"/list?","bucket=",local_40,"&prefix=",local_88,
                                   "&delimiter=",local_98,"&marker=",local_80,"&limit=",pcVar4,0);
    }
    Qiniu_Free(pcVar4);
    pcVar4 = local_68;
    if (escapeBucketOk != 0) {
      Qiniu_Free(pcVar5);
    }
    pQVar1 = local_48;
    if ((local_78 != (char *)0x0) && (escapePrefixOk != 0)) {
      Qiniu_Free(local_88);
    }
    if ((local_70 != (char *)0x0) && (escapeDelimiterOk != 0)) {
      Qiniu_Free(local_98);
    }
    if ((pcVar4 != (char *)0x0) && (escapeMarkerOk != 0)) {
      Qiniu_Free(local_80);
    }
    if (uVar3 == 200) {
      QVar15 = Qiniu_Client_Call(self,&root,bucket);
      local_50 = QVar15.message;
      uVar3 = QVar15.code;
      Qiniu_Free(bucket);
      if (uVar3 == 200) {
        pcVar5 = Qiniu_Json_GetString(root,"marker",(char *)0x0);
        pQVar1->marker = pcVar5;
        uVar3 = Qiniu_Json_GetArraySize(root,"commonPrefixes",0);
        if ((int)uVar3 < 1) {
          pQVar1->commonPrefixes = (char **)0x0;
          pQVar1->commonPrefixesCount = 0;
        }
        else {
          pQVar1->commonPrefixesCount = uVar3;
          ppcVar6 = (char **)malloc((ulong)uVar3 * 8);
          pQVar1->commonPrefixes = ppcVar6;
          pQVar7 = Qiniu_Json_GetObjectItem(root,"commonPrefixes",(Qiniu_Json *)0x0);
          for (lVar13 = 0; uVar3 != (uint)lVar13; lVar13 = lVar13 + 1) {
            pQVar8 = Qiniu_Json_GetArrayItem(pQVar7,(uint)lVar13,(Qiniu_Json *)0x0);
            ppcVar6[lVar13] = pQVar8->valuestring;
          }
        }
        uVar3 = Qiniu_Json_GetArraySize(root,"items",0);
        if ((int)uVar3 < 1) {
          pQVar1->items = (_Qiniu_RSF_ListItem *)0x0;
          pQVar1->itemsCount = 0;
        }
        else {
          pQVar1->itemsCount = uVar3;
          local_80 = (char *)(ulong)uVar3;
          p_Var9 = (_Qiniu_RSF_ListItem *)malloc((long)local_80 * 0x38);
          pQVar1->items = p_Var9;
          local_88 = Qiniu_Json_GetObjectItem(root,"items",(Qiniu_Json *)0x0);
          lVar13 = 0x30;
          for (uVar14 = 0; local_80 != (char *)uVar14; uVar14 = uVar14 + 1) {
            pQVar7 = Qiniu_Json_GetArrayItem(local_88,(int)uVar14,(Qiniu_Json *)0x0);
            local_68 = Qiniu_Json_GetString(pQVar7,"key",(char *)0x0);
            local_70 = Qiniu_Json_GetString(pQVar7,"hash",(char *)0x0);
            local_78 = Qiniu_Json_GetString(pQVar7,"mimeType",(char *)0x0);
            pcVar5 = Qiniu_Json_GetString(pQVar7,"endUser",(char *)0x0);
            pcVar4 = (char *)0x0;
            if (pcVar5 != (char *)0x0) {
              pcVar4 = Qiniu_Json_GetString(pQVar7,"endUser",(char *)0x0);
            }
            QVar10 = Qiniu_Json_GetInt64(pQVar7,"putTime",0);
            QVar11 = Qiniu_Json_GetInt64(pQVar7,"fsize",0);
            QVar12 = Qiniu_Json_GetInt64(pQVar7,"type",0);
            p_Var9 = local_48->items;
            *(char **)((long)p_Var9 + lVar13 + -0x30) = local_68;
            *(char **)((long)p_Var9 + lVar13 + -0x28) = local_70;
            *(char **)((long)p_Var9 + lVar13 + -0x20) = local_78;
            *(char **)((long)p_Var9 + lVar13 + -0x18) = pcVar4;
            *(Qiniu_Int64 *)((long)p_Var9 + lVar13 + -0x10) = QVar11;
            *(Qiniu_Int64 *)((long)p_Var9 + lVar13 + -8) = QVar10;
            *(Qiniu_Int64 *)((long)&p_Var9->key + lVar13) = QVar12;
            lVar13 = lVar13 + 0x38;
          }
        }
        uVar3 = 200;
      }
    }
  }
  QVar15._4_4_ = 0;
  QVar15.code = uVar3;
  QVar15.message = local_50;
  return QVar15;
}

Assistant:

Qiniu_Error Qiniu_RSF_ListFiles(Qiniu_Client *self, Qiniu_RSF_ListRet *ret, const char *bucket, const char *prefix,
                                const char *delimiter, const char *marker, int limit)
{
    Qiniu_Error err;
    int i;
    int prefixCount;
    int itemCount;

    if (limit < 1 || limit > 1000)
    {
        err.code = 400;
        err.message = "invalid list limit";
        return err;
    }

    cJSON *root;
    char *encodedBucket = NULL;
    char *encodedMarker = NULL;
    char *encodedPrefix = NULL;
    char *encodedDelimiter = NULL;

    char *url;
    const char *rsfHost;

    Qiniu_Bool escapeBucketOk;
    Qiniu_Bool escapePrefixOk;
    Qiniu_Bool escapeDelimiterOk;
    Qiniu_Bool escapeMarkerOk;

    encodedBucket = Qiniu_QueryEscape(bucket, &escapeBucketOk);

    if (prefix)
    {
        encodedPrefix = Qiniu_QueryEscape(prefix, &escapePrefixOk);
    }
    else
    {
        encodedPrefix = "";
    }

    if (marker)
    {
        encodedMarker = Qiniu_QueryEscape(marker, &escapeMarkerOk);
    }
    else
    {
        encodedMarker = "";
    }

    if (delimiter)
    {
        encodedDelimiter = Qiniu_QueryEscape(delimiter, &escapeDelimiterOk);
    }
    else
    {
        encodedDelimiter = "";
    }

    size_t limitLen = snprintf(NULL, 0, "%d", limit) + 1;
    char *limitStr = (char *)malloc(sizeof(char) * limitLen);
    memset(limitStr, 0, limitLen);
    snprintf(limitStr, limitLen, "%d", limit);

    err = _Qiniu_Region_Get_Rsf_Host(self, NULL, bucket, &rsfHost);

    if (err.code == 200)
    {
        url = Qiniu_String_Concat(rsfHost, "/list?", "bucket=", encodedBucket, "&prefix=", encodedPrefix,
                                  "&delimiter=", encodedDelimiter, "&marker=", encodedMarker, "&limit=", limitStr, NULL);
    }

    Qiniu_Free(limitStr);

    if (escapeBucketOk)
    {
        Qiniu_Free(encodedBucket);
    }

    if (prefix && escapePrefixOk)
    {
        Qiniu_Free(encodedPrefix);
    }

    if (delimiter && escapeDelimiterOk)
    {
        Qiniu_Free(encodedDelimiter);
    }

    if (marker && escapeMarkerOk)
    {
        Qiniu_Free(encodedMarker);
    }

    if (err.code != 200)
    {
        return err;
    }

    err = Qiniu_Client_Call(self, &root, url);
    Qiniu_Free(url);
    if (err.code == 200)
    {
        ret->marker = Qiniu_Json_GetString(root, "marker", NULL);
        // check common prefixes
        prefixCount = Qiniu_Json_GetArraySize(root, "commonPrefixes", 0);
        if (prefixCount > 0)
        {
            ret->commonPrefixesCount = prefixCount;
            ret->commonPrefixes = (char **)malloc(sizeof(char **) * prefixCount);
            char **p = ret->commonPrefixes;
            Qiniu_Json *commonPrefixes = Qiniu_Json_GetObjectItem(root, "commonPrefixes", NULL);
            for (i = 0; i < prefixCount; i++)
            {
                *p = Qiniu_Json_GetArrayItem(commonPrefixes, i, NULL)->valuestring;
                ++p;
            }
        }
        else
        {
            ret->commonPrefixes = NULL;
            ret->commonPrefixesCount = 0;
        }
        // check items
        itemCount = Qiniu_Json_GetArraySize(root, "items", 0);
        if (itemCount > 0)
        {
            ret->itemsCount = itemCount;
            ret->items = (Qiniu_RSF_ListItem *)malloc(sizeof(Qiniu_RSF_ListItem) * itemCount);

            Qiniu_Json *items = Qiniu_Json_GetObjectItem(root, "items", NULL);
            Qiniu_RSF_ListItem *nextItem = 0;
            for (i = 0; i < itemCount; i++)
            {
                Qiniu_Json *itemObj = Qiniu_Json_GetArrayItem(items, i, NULL);
                Qiniu_RSF_ListItem item;
                item.key = Qiniu_Json_GetString(itemObj, "key", NULL);
                item.hash = Qiniu_Json_GetString(itemObj, "hash", NULL);
                item.mimeType = Qiniu_Json_GetString(itemObj, "mimeType", NULL);
                if (Qiniu_Json_GetString(itemObj, "endUser", NULL) != 0)
                {
                    item.endUser = Qiniu_Json_GetString(itemObj, "endUser", NULL);
                }
                else
                {
                    item.endUser = NULL;
                }
                item.putTime = Qiniu_Json_GetInt64(itemObj, "putTime", 0);
                item.fsize = Qiniu_Json_GetInt64(itemObj, "fsize", 0);
                item.type = Qiniu_Json_GetInt64(itemObj, "type", 0);

                ret->items[i] = item;
            }
        }
        else
        {
            ret->items = NULL;
            ret->itemsCount = 0;
        }
    }

    return err;
}